

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

void __thiscall
google::
dense_hashtable<std::pair<A_const,int>,A,HashA,google::dense_hash_map<A,int,HashA,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>::SelectKey,google::dense_hash_map<A,int,HashA,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>::SetKey,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>
::
copy_or_move_from<google::dense_hashtable<std::pair<A_const,int>,A,HashA,google::dense_hash_map<A,int,HashA,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>::SelectKey,google::dense_hash_map<A,int,HashA,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>::SetKey,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>>
          (dense_hashtable<std::pair<A_const,int>,A,HashA,google::dense_hash_map<A,int,HashA,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>::SelectKey,google::dense_hash_map<A,int,HashA,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>::SetKey,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>
           *this,dense_hashtable<std::pair<const_A,_int>,_A,_HashA,_google::dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SelectKey,_google::dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
                 *ht,size_type min_buckets_wanted)

{
  int iVar1;
  size_type sVar2;
  pointer ppVar3;
  long lVar4;
  pair<const_A,_int> *value;
  size_type new_num_buckets;
  pointer ppVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  
  new_num_buckets =
       sparsehash_internal::sh_hashtable_settings<A,_HashA,_unsigned_long,_4>::min_buckets
                 ((sh_hashtable_settings<A,_HashA,_unsigned_long,_4> *)this,
                  ht->num_elements - ht->num_deleted,min_buckets_wanted);
  dense_hashtable<std::pair<const_A,_int>,_A,_HashA,_google::dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SelectKey,_google::dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
  ::clear_to_size((dense_hashtable<std::pair<const_A,_int>,_A,_HashA,_google::dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SelectKey,_google::dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
                   *)this,new_num_buckets);
  sVar2 = ht->num_buckets;
  ppVar3 = ht->table;
  ppVar5 = ppVar3;
  if (sVar2 == 0) {
LAB_00a53e3a:
    ppVar3 = ppVar3 + sVar2;
    if (ppVar5 != ppVar3) {
      lVar7 = *(long *)(this + 0x38);
      lVar4 = *(long *)(this + 0x48);
      do {
        uVar6 = (long)(ppVar5->first)._i & lVar7 - 1U;
        if (*(int *)(this + 0x24) != *(int *)(lVar4 + uVar6 * 8)) {
          lVar8 = 1;
          do {
            uVar6 = uVar6 + lVar8 & lVar7 - 1U;
            lVar8 = lVar8 + 1;
          } while (*(int *)(this + 0x24) != *(int *)(lVar4 + uVar6 * 8));
        }
        *(undefined4 *)(lVar4 + uVar6 * 8) = 0;
        *(int *)(lVar4 + uVar6 * 8) = (ppVar5->first)._i;
        A::copy_ctor = A::copy_ctor + 1;
        *(int *)(lVar4 + 4 + uVar6 * 8) = ppVar5->second;
        *(long *)(this + 0x30) = *(long *)(this + 0x30) + 1;
        ppVar5 = ppVar5 + 1;
        if (ppVar5 != ppVar3) {
          do {
            iVar1 = (ppVar5->first)._i;
            if (((ht->key_info).empty_key._i != iVar1) &&
               (ht->num_deleted == 0 || (ht->key_info).delkey._i != iVar1)) break;
            ppVar5 = ppVar5 + 1;
          } while (ppVar5 != ppVar3);
        }
      } while (ppVar5 != ppVar3);
    }
  }
  else {
    lVar7 = sVar2 * 8;
    do {
      iVar1 = (ppVar5->first)._i;
      if (((ht->key_info).empty_key._i != iVar1) &&
         (ht->num_deleted == 0 || (ht->key_info).delkey._i != iVar1)) goto LAB_00a53e3a;
      ppVar5 = ppVar5 + 1;
      lVar7 = lVar7 + -8;
    } while (lVar7 != 0);
  }
  *(int *)(this + 0x1c) = *(int *)(this + 0x1c) + 1;
  return;
}

Assistant:

void copy_or_move_from(Hashtable&& ht, size_type min_buckets_wanted) {
    clear_to_size(settings.min_buckets(ht.size(), min_buckets_wanted));

    // We use a normal iterator to get non-deleted bcks from ht
    // We could use insert() here, but since we know there are
    // no duplicates and no deleted items, we can be more efficient
    assert((bucket_count() & (bucket_count() - 1)) == 0);  // a power of two
    for (auto&& value : ht) {
      size_type num_probes = 0;  // how many times we've probed
      size_type bucknum;
      const size_type bucket_count_minus_one = bucket_count() - 1;
      for (bucknum = hash(get_key(value)) & bucket_count_minus_one;
           !test_empty(bucknum);  // not empty
           bucknum =
               (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one) {
        ++num_probes;
        assert(num_probes < bucket_count() &&
               "Hashtable is full: an error in key_equal<> or hash<>");
      }

      using will_move = std::is_rvalue_reference<Hashtable&&>;
      using value_t = typename std::conditional<will_move::value, value_type&&, const_reference>::type;

      set_value(&table[bucknum], std::forward<value_t>(value));
      num_elements++;
    }
    settings.inc_num_ht_copies();
  }